

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O2

void forward_DCT_float(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY sample_data,
                      JBLOCKROW coef_blocks,JDIMENSION start_row,JDIMENSION start_col,
                      JDIMENSION num_blocks)

{
  jpeg_forward_dct *pjVar1;
  _func_void_j_compress_ptr *p_Var2;
  _func_void_j_compress_ptr *p_Var3;
  j_compress_ptr pjVar4;
  ulong uVar5;
  JBLOCKROW paJVar6;
  JDIMENSION JVar7;
  ulong uVar8;
  bool bVar9;
  JBLOCKROW paJVar10;
  
  uVar8 = (ulong)num_blocks;
  pjVar1 = cinfo->fdct;
  p_Var2 = pjVar1[5].start_pass;
  paJVar6 = (JBLOCKROW)pjVar1[5].forward_DCT;
  p_Var3 = pjVar1[6].start_pass;
  pjVar4 = (j_compress_ptr)pjVar1[8].forward_DCT;
  uVar5 = (ulong)start_row;
  JVar7 = start_col;
  paJVar10 = paJVar6;
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    (*(code *)paJVar10)((j_compress_ptr)(sample_data + uVar5),(jpeg_component_info *)(ulong)JVar7,
                        (JSAMPARRAY)pjVar4,paJVar6,start_row,start_col,(JDIMENSION)paJVar10);
    (*p_Var2)(pjVar4);
    (*p_Var3)((j_compress_ptr)coef_blocks);
    JVar7 = JVar7 + 8;
    coef_blocks = (JBLOCKROW)((j_compress_ptr)coef_blocks)->dc_huff_tbl_ptrs;
  }
  return;
}

Assistant:

METHODDEF(void)
forward_DCT_float(j_compress_ptr cinfo, jpeg_component_info *compptr,
                  JSAMPARRAY sample_data, JBLOCKROW coef_blocks,
                  JDIMENSION start_row, JDIMENSION start_col,
                  JDIMENSION num_blocks)
/* This version is used for floating-point DCT implementations. */
{
  /* This routine is heavily used, so it's worth coding it tightly. */
  my_fdct_ptr fdct = (my_fdct_ptr)cinfo->fdct;
  FAST_FLOAT *divisors = fdct->float_divisors[compptr->quant_tbl_no];
  FAST_FLOAT *workspace;
  JDIMENSION bi;


  /* Make sure the compiler doesn't look up these every pass */
  float_DCT_method_ptr do_dct = fdct->float_dct;
  float_convsamp_method_ptr do_convsamp = fdct->float_convsamp;
  float_quantize_method_ptr do_quantize = fdct->float_quantize;
  workspace = fdct->float_workspace;

  sample_data += start_row;     /* fold in the vertical offset once */

  for (bi = 0; bi < num_blocks; bi++, start_col += DCTSIZE) {
    /* Load data into workspace, applying unsigned->signed conversion */
    (*do_convsamp) (sample_data, start_col, workspace);

    /* Perform the DCT */
    (*do_dct) (workspace);

    /* Quantize/descale the coefficients, and store into coef_blocks[] */
    (*do_quantize) (coef_blocks[bi], divisors, workspace);
  }
}